

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  byte bVar1;
  Expr *p_00;
  int iVar2;
  int iVar3;
  ExprList *pEVar4;
  Expr *pEVar5;
  char *pcVar6;
  byte bVar7;
  long lVar8;
  Expr *local_38;
  
  if (p != (ExprList *)0x0) {
    iVar2 = sqlite3DbMallocSize(db,p);
    pEVar4 = (ExprList *)sqlite3DbMallocRawNN(db,(long)iVar2);
    iVar2 = 0;
    if (pEVar4 != (ExprList *)0x0) {
      iVar3 = p->nExpr;
      pEVar4->nExpr = iVar3;
      lVar8 = 8;
      local_38 = (Expr *)0x0;
      for (; iVar2 < iVar3; iVar2 = iVar2 + 1) {
        p_00 = *(Expr **)((long)p->a + lVar8 + -8);
        pEVar5 = sqlite3ExprDup(db,p_00,flags);
        *(Expr **)((long)pEVar4->a + lVar8 + -8) = pEVar5;
        if ((p_00 != (Expr *)0x0) && (pEVar5 != (Expr *)0x0 && p_00->op == 0xaa)) {
          if (pEVar5->iColumn == 0) {
            local_38 = pEVar5->pRight;
          }
          pEVar5->pLeft = local_38;
        }
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].pExpr + lVar8));
        *(char **)((long)&pEVar4->a[0].pExpr + lVar8) = pcVar6;
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].zName + lVar8));
        *(char **)((long)&pEVar4->a[0].zName + lVar8) = pcVar6;
        *(undefined1 *)((long)&pEVar4->a[0].zSpan + lVar8) =
             *(undefined1 *)((long)&p->a[0].zSpan + lVar8);
        bVar1 = *(byte *)((long)&pEVar4->a[0].zSpan + lVar8 + 1);
        *(byte *)((long)&pEVar4->a[0].zSpan + lVar8 + 1) = bVar1 & 0xfe;
        bVar7 = *(byte *)((long)&p->a[0].zSpan + lVar8 + 1) & 2;
        *(byte *)((long)&pEVar4->a[0].zSpan + lVar8 + 1) = bVar1 & 0xfc | bVar7;
        *(byte *)((long)&pEVar4->a[0].zSpan + lVar8 + 1) =
             bVar1 & 0xf4 | bVar7 | *(byte *)((long)&p->a[0].zSpan + lVar8 + 1) & 8;
        *(undefined4 *)((long)&pEVar4->a[0].zSpan + lVar8 + 4) =
             *(undefined4 *)((long)&p->a[0].zSpan + lVar8 + 4);
        iVar3 = p->nExpr;
        lVar8 = lVar8 + 0x20;
      }
      return pEVar4;
    }
  }
  return (ExprList *)0x0;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem, *pOldItem;
  int i;
  Expr *pPriorSelectCol = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sqlite3DbMallocSize(db, p));
  if( pNew==0 ) return 0;
  pNew->nExpr = p->nExpr;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr 
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0 
    ){
      assert( pNewExpr->iColumn==0 || i>0 );
      if( pNewExpr->iColumn==0 ){
        assert( pOldExpr->pLeft==pOldExpr->pRight );
        pPriorSelectCol = pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        assert( i>0 );
        assert( pItem[-1].pExpr!=0 );
        assert( pNewExpr->iColumn==pItem[-1].pExpr->iColumn+1 );
        assert( pPriorSelectCol==pItem[-1].pExpr->pLeft );
        pNewExpr->pLeft = pPriorSelectCol;
      }
    }
    pItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pItem->zSpan = sqlite3DbStrDup(db, pOldItem->zSpan);
    pItem->sortOrder = pOldItem->sortOrder;
    pItem->done = 0;
    pItem->bSpanIsTab = pOldItem->bSpanIsTab;
    pItem->bSorterRef = pOldItem->bSorterRef;
    pItem->u = pOldItem->u;
  }
  return pNew;
}